

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

int levmar(custom_funcmult *funcmult,custom_jacobian *jacobian,double *xi,int M,int N,double *xf)

{
  int *ipvt_00;
  double __x;
  double gtol_00;
  double xtol;
  double gtol;
  double ftol;
  double epsfcn;
  double eps;
  double factor;
  int *ipvt;
  int maxfev;
  int nprint;
  int njev;
  int nfev;
  int mode;
  int ldfjac;
  double *qtf;
  double *diag;
  double *fjac;
  double *fvec;
  int i;
  int info;
  double *xf_local;
  int N_local;
  int M_local;
  double *xi_local;
  custom_jacobian *jacobian_local;
  custom_funcmult *funcmult_local;
  
  _i = xf;
  xf_local._0_4_ = N;
  xf_local._4_4_ = M;
  _N_local = xi;
  xi_local = (double *)jacobian;
  jacobian_local = (custom_jacobian *)funcmult;
  fjac = (double *)malloc((long)M << 3);
  diag = (double *)malloc((long)xf_local._4_4_ * 8 * (long)(int)xf_local);
  qtf = (double *)malloc((long)(int)xf_local << 3);
  _mode = (double *)malloc((long)(int)xf_local << 3);
  ipvt_00 = (int *)malloc((long)(int)xf_local << 2);
  __x = macheps();
  gtol_00 = pow(__x,0.3333333333333333);
  nfev = xf_local._4_4_;
  maxfev = 0;
  nprint = 0;
  njev = 1;
  for (fvec._0_4_ = 0; (int)fvec < (int)xf_local; fvec._0_4_ = (int)fvec + 1) {
    _i[(int)fvec] = _N_local[(int)fvec];
  }
  if (xi_local == (double *)0x0) {
    fvec._4_4_ = lmdif((custom_funcmult *)jacobian_local,_i,xf_local._4_4_,(int)xf_local,fjac,diag,
                       xf_local._4_4_,1000,qtf,1,100.0,0,__x,__x,gtol_00 * gtol_00,gtol_00,__x,
                       &nprint,&maxfev,ipvt_00,_mode);
  }
  else {
    fvec._4_4_ = lmder((custom_funcmult *)jacobian_local,(custom_jacobian *)xi_local,_i,
                       xf_local._4_4_,(int)xf_local,fjac,diag,xf_local._4_4_,1000,qtf,1,100.0,0,__x,
                       gtol_00 * gtol_00,gtol_00,__x,&nprint,&maxfev,ipvt_00,_mode);
  }
  free(fjac);
  free(diag);
  free(qtf);
  free(_mode);
  free(ipvt_00);
  return fvec._4_4_;
}

Assistant:

int levmar(custom_funcmult *funcmult, custom_jacobian *jacobian,
		double *xi,int M, int N,double *xf) {
	int info,i;
	double *fvec,*fjac,*diag,*qtf;
	int ldfjac,mode,nfev,njev,nprint,maxfev;
	int *ipvt;
	double factor,eps,epsfcn,ftol,gtol,xtol;

	fvec = (double*) malloc(sizeof(double) *M);
	fjac = (double*) malloc(sizeof(double) *M * N);
	diag = (double*) malloc(sizeof(double) *N);
	qtf = (double*) malloc(sizeof(double) *N);
	ipvt = (int*) malloc(sizeof(int) *N);

	eps = macheps();
	epsfcn = eps;
	gtol = pow(eps,1.0/3.0);
	ftol = gtol * gtol;
	xtol = eps;
	factor = 100.;
	ldfjac = M;
	nfev = njev = nprint = 0;
	mode = 1;
	maxfev = 1000;

	for(i = 0; i < N;++i) {
		xf[i] = xi[i];
	}

	if (jacobian == NULL) {
		info = lmdif(funcmult,xf,M,N,fvec,fjac,ldfjac,maxfev,diag,mode,factor,nprint,eps,epsfcn,ftol,gtol,
				xtol,&nfev,&njev,ipvt,qtf);
	} else {
		info = lmder(funcmult,jacobian,xf,M,N,fvec,fjac,ldfjac,maxfev,diag,mode,factor,nprint,eps,ftol,gtol,
				xtol,&nfev,&njev,ipvt,qtf);
	}


	free(fvec);
	free(fjac);
	free(diag);
	free(qtf);
	free(ipvt);

	return info;
}